

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
SingleNodeColumnSampler<long_double,_float>::restore
          (SingleNodeColumnSampler<long_double,_float> *this,
          SingleNodeColumnSampler<long_double,_float> *other)

{
  value_type vVar1;
  byte bVar2;
  const_reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  long in_RSI;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  size_t col_1;
  size_t col;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  vector<bool,_std::allocator<bool>_> *this_01;
  reference in_stack_ffffffffffffffb0;
  double local_40;
  double local_38;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffd0;
  
  __first._M_current = (double *)in_stack_ffffffffffffffb0._M_p;
  in_RDI._M_current[8] = *(double *)(in_RSI + 0x40);
  in_RDI._M_current[0xf] = *(double *)(in_RSI + 0x78);
  *(byte *)(in_RDI._M_current + 0xb) = *(byte *)(in_RSI + 0x58) & 1;
  if (((ulong)in_RDI._M_current[0xb] & 1) == 0) {
    *(unkbyte10 *)(in_RDI._M_current + 6) = *(unkbyte10 *)(in_RSI + 0x30);
    if ((*(byte *)((long)in_RDI._M_current + 0x59) & 1) != 0) {
      for (local_38 = 0.0; (ulong)local_38 < (ulong)in_RDI._M_current[0xf];
          local_38 = (double)((long)local_38 + 1)) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x60),
                            (size_type)local_38);
        vVar1 = *pvVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI._M_current + 0xc),
                            *(size_type *)((long)in_RDI._M_current[9] + (long)local_38 * 8));
        *pvVar4 = vVar1;
      }
    }
    sVar5 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffd0);
    if (sVar5 != 0) {
      for (local_40 = 0.0;
          this_01 = (vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffb0._M_p,
          (ulong)local_40 < (ulong)in_RDI._M_current[0xf]; local_40 = (double)((long)local_40 + 1))
      {
        bVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (this_01,(size_type)in_RDI._M_current);
        in_stack_ffffffffffffffb0 =
             std::vector<bool,_std::allocator<bool>_>::operator[]
                       (this_01,(size_type)in_RDI._M_current);
        std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffb0,(bool)(bVar2 & 1))
        ;
      }
    }
  }
  else {
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    std::vector<double,std::allocator<double>>::
    assign<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
              (in_stack_ffffffffffffffa0,__first,in_RDI);
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI._M_current + 0x1b);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    assign<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              (this_00,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )__first._M_current,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )in_RDI._M_current);
  }
  return;
}

Assistant:

void SingleNodeColumnSampler<ldouble_safe, real_t>::restore(const SingleNodeColumnSampler &other)
{
    this->n_inf = other.n_inf;
    this->n_left = other.n_left;
    this->using_tree = other.using_tree;

    if (this->using_tree)
    {
        this->tree_weights.assign(other.tree_weights.begin(), other.tree_weights.end());
        this->mapped_inf_indices.assign(other.mapped_inf_indices.begin(), other.mapped_inf_indices.end());
    }

    else
    {
        this->cumw = other.cumw;
        if (this->backup_weights)
        {
            for (size_t col = 0; col < this->n_left; col++)
                this->weights_own[this->col_indices[col]] = other.weights_own[col];
        }

        if (this->inifinite_weights.size())
        {
            for (size_t col = 0; col < this->n_left; col++)
                this->inifinite_weights[this->col_indices[col]] = other.inifinite_weights[col];
        }
    }
}